

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_pointer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  SPIRType *type;
  string local_40;
  
  type = Compiler::expression_type(&this->super_Compiler,id);
  bVar1 = Compiler::is_pointer(&this->super_Compiler,type);
  if (((bVar1) && (bVar1 = Compiler::expression_is_lvalue(&this->super_Compiler,id), bVar1)) &&
     (bVar1 = should_dereference(this,id), !bVar1)) {
    to_enclosed_expression_abi_cxx11_(&local_40,this,id,register_expression_read);
    address_of_expression(__return_storage_ptr__,this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_40._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,id,register_expression_read);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_pointer_expression(uint32_t id, bool register_expression_read)
{
	auto &type = expression_type(id);
	if (is_pointer(type) && expression_is_lvalue(id) && !should_dereference(id))
		return address_of_expression(to_enclosed_expression(id, register_expression_read));
	else
		return to_unpacked_expression(id, register_expression_read);
}